

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  ImGuiContextHook *pIVar1;
  ImGuiID IVar2;
  bool bVar3;
  ImGuiContext *g;
  ImGuiContextHook *hook_local;
  ImGuiContext *ctx_local;
  
  bVar3 = false;
  if ((*(long *)(hook + 0x10) != 0) && (bVar3 = false, *(int *)hook == 0)) {
    bVar3 = *(int *)(hook + 4) != 7;
  }
  if (!bVar3) {
    __assert_fail("hook->Callback != __null && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0xd5c,"ImGuiID ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
  }
  ImVector<ImGuiContextHook>::push_back(&ctx->Hooks,hook);
  IVar2 = ctx->HookIdNext + 1;
  ctx->HookIdNext = IVar2;
  pIVar1 = ImVector<ImGuiContextHook>::back(&ctx->Hooks);
  *(ImGuiID *)pIVar1 = IVar2;
  return ctx->HookIdNext;
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}